

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void crnd::crnd_assert(char *pExp,char *pFile,uint line)

{
  bool bVar1;
  char local_228 [8];
  char buf [512];
  uint line_local;
  char *pFile_local;
  char *pExp_local;
  
  sprintf(local_228,"%s(%u): Assertion failure: \"%s\"\n",pFile,(ulong)line,pExp);
  crnd_output_debug_string(local_228);
  puts(local_228);
  bVar1 = crnd_is_debugger_present();
  if (bVar1) {
    crnd_debug_break();
  }
  return;
}

Assistant:

void crnd_assert(const char* pExp, const char* pFile, unsigned line)
    {
        char buf[512];

#if defined(WIN32) && defined(_MSC_VER)
        sprintf_s(buf, sizeof(buf), "%s(%u): Assertion failure: \"%s\"\n", pFile, line, pExp);
#else
  sprintf(buf, "%s(%u): Assertion failure: \"%s\"\n", pFile, line, pExp);
#endif

        crnd_output_debug_string(buf);

        puts(buf);

        if (crnd_is_debugger_present())
            crnd_debug_break();
    }